

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initDeploymentTool(VcprojGenerator *this)

{
  QString *pQVar1;
  QMakeProject *pQVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  byte bVar6;
  ProString *pPVar7;
  Data *pDVar8;
  undefined8 uVar9;
  char cVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  ProStringList *pPVar14;
  ProStringList *two;
  qsizetype qVar15;
  ProString *pPVar16;
  ProString *pPVar17;
  char *pcVar18;
  QList<ProString> *pQVar19;
  iterator iVar20;
  iterator iVar21;
  iterator this_00;
  iterator iVar22;
  QLatin1String *pQVar23;
  DirEntry DVar24;
  ProString *dllPath;
  QChar QVar25;
  int iVar26;
  const_iterator __begin5;
  long lVar27;
  ProString *pPVar28;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView s;
  QLatin1StringView s_00;
  initializer_list<QString> args;
  QLatin1StringView latin1_00;
  QArrayDataPointer<char16_t> local_380;
  QArrayDataPointer<char16_t> local_368;
  QStringBuilder<QString,_const_char_(&)[2]> local_348;
  QFileInfo info2;
  QDirListing dirList;
  QFileInfo info;
  QFileInfo info_1;
  QArrayDataPointer<char16_t> local_2d8;
  QArrayDataPointer<char16_t> local_2b8;
  undefined1 local_298 [32];
  QArrayDataPointer<ProString> local_278;
  QArrayDataPointer<ProString> local_260;
  undefined1 local_248 [32];
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>
  local_228;
  undefined1 local_1d8 [48];
  QArrayDataPointer<char16_t> local_1a8;
  QLatin1Char local_190;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>
  local_180;
  undefined1 local_128 [80];
  char *local_d8;
  qsizetype local_c0;
  char *local_b8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>
  local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_128,"deploy.path");
  pPVar14 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_128);
  ProStringList::join((QString *)&local_a8,pPVar14,(QChar)0x20);
  pQVar1 = local_a8.a.a.a.a.a.a.b;
  local_248._8_8_ = local_a8.a.a.a.a.a.a.a.m_data;
  local_248._0_8_ = local_a8.a.a.a.a.a.a.a.m_size;
  local_a8.a.a.a.a.a.a.a.m_size = 0;
  local_a8.a.a.a.a.a.a.a.m_data = (char *)0x0;
  local_248._16_8_ = local_a8.a.a.a.a.a.a.b;
  local_a8.a.a.a.a.a.a.b = (QString *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
  if (pQVar1 == (QString *)0x0) {
    QString::QString((QString *)&local_228,"%CSIDL_PROGRAM_FILES%\\");
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_180,"TARGET");
    QMakeEvaluator::first((ProString *)&local_a8,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_180)
    ;
    QStringBuilder<QString,_ProString>::QStringBuilder
              ((QStringBuilder<QString,_ProString> *)local_128,(QString *)&local_228,
               (ProString *)&local_a8);
    QStringBuilder<QString,_ProString>::convertTo<QString>
              ((QString *)local_1d8,(QStringBuilder<QString,_ProString> *)local_128);
    uVar9 = local_248._16_8_;
    pDVar4 = (Data *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    pcVar5 = (char16_t *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
    local_1d8._0_4_ = local_248._0_4_;
    local_1d8._4_4_ = local_248._4_4_;
    local_1d8._8_4_ = local_248._8_4_;
    local_1d8._12_4_ = local_248._12_4_;
    local_248._16_8_ = local_1d8._16_8_;
    local_1d8._16_8_ = uVar9;
    local_248._0_8_ = pDVar4;
    local_248._8_8_ = pcVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1d8);
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_180);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
  }
  QString::QString((QString *)local_128,"/");
  cVar10 = QString::endsWith((QString *)local_248,(CaseSensitivity)(QString *)local_128);
  if (cVar10 == '\0') {
    QString::QString((QString *)&local_a8,"\\");
    cVar10 = QString::endsWith((QString *)local_248,(CaseSensitivity)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    if (cVar10 == '\0') goto LAB_001cebf3;
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
  }
  QString::chop((longlong)local_248);
LAB_001cebf3:
  QString::operator=(&(this->vcProject).Configuration.deployment.RemoteDirectory,
                     (QString *)local_248);
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_128,"QMAKE_DLL_PATHS");
  pPVar14 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_128);
  local_260.d = (pPVar14->super_QList<ProString>).d.d;
  local_260.ptr = (pPVar14->super_QList<ProString>).d.ptr;
  lVar3 = (pPVar14->super_QList<ProString>).d.size;
  if (local_260.d != (Data *)0x0) {
    LOCK();
    ((local_260.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_260.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_260.size = lVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
  if (lVar3 != 0) {
    local_348.a.d.size = -0x5555555555555556;
    local_348.a.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_348.a.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_128,"LIBS");
    pPVar14 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_128);
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_a8,"LIBS_PRIVATE");
    two = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_a8);
    operator+((ProStringList *)&local_278,pPVar14,two);
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_180,"QMAKE_LIBS");
    pPVar14 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_180);
    operator+((ProStringList *)&local_228,(ProStringList *)&local_278,pPVar14);
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_1d8,"QMAKE_LIBS_PRIVATE");
    pPVar14 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_1d8);
    operator+((ProStringList *)&local_348,(ProStringList *)&local_228,pPVar14);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1d8);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_228);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_180);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_278);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    pQVar1 = &(this->vcProject).Configuration.deployment.AdditionalFiles;
    bVar12 = 0;
    pPVar28 = (ProString *)local_348.a.d.ptr;
    while( true ) {
      if (pPVar28 == (ProString *)((long)local_348.a.d.ptr + local_348.a.d.size * 0x30)) break;
      local_278.size = -0x5555555555555556;
      local_278.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_278.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)&local_278,pPVar28);
      QString::replace((QChar)(char16_t)&local_278,(QChar)0x5c,0x2f);
      qVar15 = QtPrivate::lengthHelperPointer<char>("/LIBPATH:");
      cVar10 = QString::startsWith((QLatin1String *)&local_278,(CaseSensitivity)qVar15);
      if (cVar10 == '\0') {
        qVar15 = QtPrivate::lengthHelperPointer<char>(".lib");
        cVar10 = QString::endsWith((QLatin1String *)&local_278,(CaseSensitivity)qVar15);
        if (cVar10 != '\0') {
          pPVar17 = (ProString *)(local_278.size + -0x30);
          qVar15 = QtPrivate::lengthHelperPointer<char>("dll");
          latin1.m_data = "dll";
          latin1.m_size = qVar15;
          QString::QString((QString *)local_128,latin1);
          QString::replace((longlong)&local_278,(longlong)((long)&pPVar17->m_hash + 5),
                           (QString *)0x3);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
        }
        QString::lastIndexOf((QString *)&local_278,(QChar)0x2f,CaseSensitive);
        QString::remove((longlong)&local_278,0);
        _info = (ProString *)0xaaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo(&info);
        pPVar17 = local_260.ptr;
        pPVar16 = local_260.ptr;
        lVar27 = lVar3 * 0x30;
        do {
          if (lVar27 == 0) break;
          local_128._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
          local_128._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
          local_128._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
          ProString::toQString((QString *)local_128,pPVar16);
          QVar25.ucs = (char16_t)(QString *)local_128;
          cVar10 = QString::endsWith(QVar25,0x2f);
          if (cVar10 == '\0') {
            QString::append(QVar25);
          }
          QString::append((QString *)local_128);
          QFileInfo::QFileInfo((QFileInfo *)&local_a8,(QString *)local_128);
          pPVar7 = _info;
          _info = (ProString *)local_a8.a.a.a.a.a.a.a.m_size;
          local_a8.a.a.a.a.a.a.a.m_size = (qsizetype)pPVar7;
          QFileInfo::~QFileInfo((QFileInfo *)&local_a8);
          cVar10 = QFileInfo::exists();
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
          pPVar16 = pPVar16 + 1;
          lVar27 = lVar27 + -0x30;
        } while (cVar10 == '\0');
        cVar10 = QFileInfo::exists();
        if (cVar10 != '\0') {
          QFileInfo::fileName();
          local_228.a.a.a.b = (QString *)local_298._16_8_;
          local_228.a.a.a.a.m_data = (char *)local_298._8_8_;
          local_228.a.a.a.a.m_size = local_298._0_8_;
          local_298._0_8_ = (ProString *)0x0;
          local_298._8_8_ = (ProString *)0x0;
          local_298._16_8_ = (ProString *)0x0;
          local_228.a.a.b.m_size = 0x21a2c9;
          QFileInfo::absolutePath();
          QDir::toNativeSeparators((QString *)&local_2b8);
          QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::QStringBuilder
                    ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     local_1d8,(QStringBuilder<QString,_const_char_(&)[2]> *)&local_228,
                     (QString *)&local_2b8);
          QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::QStringBuilder
                    ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     &local_180,
                     (QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     local_1d8);
          local_180.a.a.b.d.ptr = L"|";
          QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>
                            *)&local_a8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>
                            *)&local_180);
          local_a8.a.a.a.b.d.size = (qsizetype)local_248;
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>
                            *)local_128,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>
                            *)&local_a8);
          local_128._72_8_ = "|0;";
          ::operator+=(pQVar1,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[4]>
                               *)local_128);
          QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     local_128);
          QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     &local_a8);
          QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     &local_180);
          QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     local_1d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_298);
          bVar6 = bVar12 & 1;
          bVar12 = 1;
          if (bVar6 == 0) {
            local_298._0_8_ = (ProString *)0x0;
            local_298._8_8_ = (ProString *)0x0;
            local_298._16_8_ = (ProString *)0x0;
            qVar15 = QtPrivate::lengthHelperPointer<char>("Guid");
            s.m_data = "Guid";
            s.m_size = qVar15;
            bVar11 = QString::contains((QString *)&local_278,s,CaseSensitive);
            if (bVar11) {
              QString::operator=((QString *)local_298,(QChar)0x64);
LAB_001cf21d:
              _info2 = (ProString *)0xaaaaaaaaaaaaaaaa;
              QFileInfo::QFileInfo(&info2);
              lVar27 = lVar3 * 0x30;
              do {
                if (lVar27 == 0) break;
                local_a8.a.a.a.a.a.a.b = (QString *)0xaaaaaaaaaaaaaaaa;
                local_a8.a.a.a.a.a.a.a.m_size = -0x5555555555555556;
                local_a8.a.a.a.a.a.a.a.m_data = (char *)0xaaaaaaaaaaaaaaaa;
                ProString::toQString((QString *)&local_a8,pPVar17);
                QVar25.ucs = (char16_t)&local_a8;
                cVar10 = QString::endsWith(QVar25,0x2f);
                if (cVar10 == '\0') {
                  QString::append(QVar25);
                }
                pPVar16 = (ProString *)
                          QtPrivate::lengthHelperPointer<char>("../plugins/platforms/qwindows");
                local_128._24_8_ = QtPrivate::lengthHelperPointer<char>(".dll");
                local_128._8_8_ = "../plugins/platforms/qwindows";
                local_128._16_8_ = local_298;
                local_128._32_8_ = ".dll";
                local_128._0_8_ = pPVar16;
                ::operator+=((QString *)&local_a8,
                             (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>
                              *)local_128);
                QFileInfo::QFileInfo((QFileInfo *)local_128,(QString *)&local_a8);
                pPVar16 = _info2;
                _info2 = (ProString *)local_128._0_8_;
                local_128._0_8_ = pPVar16;
                QFileInfo::~QFileInfo((QFileInfo *)local_128);
                cVar10 = QFileInfo::exists();
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_a8);
                pPVar17 = pPVar17 + 1;
                lVar27 = lVar27 + -0x30;
              } while (cVar10 == '\0');
              bVar12 = QFileInfo::exists();
              if (bVar12 != 0) {
                pPVar17 = (ProString *)QtPrivate::lengthHelperPointer<char>("qwindows");
                pcVar18 = (char *)QtPrivate::lengthHelperPointer<char>(".dll");
                QFileInfo::absolutePath();
                QDir::toNativeSeparators((QString *)&local_2b8);
                local_228.b.d.size = local_2b8.size;
                local_228.b.d.ptr = local_2b8.ptr;
                local_228.b.d.d = local_2b8.d;
                local_228.a.a.a.a.m_data = "qwindows";
                local_228.a.a.a.b = (QString *)local_298;
                local_228.a.a.b.m_data = ".dll";
                local_228.a.b.ch = '|';
                local_2b8.d = (Data *)0x0;
                local_2b8.ptr = (char16_t *)0x0;
                local_2b8.size = 0;
                local_228.a.a.a.a.m_size = (qsizetype)pPVar17;
                local_228.a.a.b.m_size = (qsizetype)pcVar18;
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>
                                  *)local_1d8,&local_228);
                local_190.ch = '|';
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>
                ::QStringBuilder(&local_180.a,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>
                                  *)local_1d8);
                local_180.b = (QString *)local_248;
                qVar15 = QtPrivate::lengthHelperPointer<char>("\\platforms");
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>
                ::QStringBuilder(&local_a8.a,&local_180);
                local_a8.b.m_data = "\\platforms";
                local_a8.b.m_size = qVar15;
                qVar15 = QtPrivate::lengthHelperPointer<char>("|0;");
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>
                                  *)local_128,&local_a8);
                local_b8 = "|0;";
                local_c0 = qVar15;
                ::operator+=(pQVar1,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                                     *)local_128);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)(local_128 + 0x30));
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8.a.a.a.b.d);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180.a.a.b.d);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228.b.d);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
              }
              QFileInfo::~QFileInfo(&info2);
            }
            else {
              qVar15 = QtPrivate::lengthHelperPointer<char>("Gui");
              s_00.m_data = "Gui";
              s_00.m_size = qVar15;
              bVar11 = QString::contains((QString *)&local_278,s_00,CaseSensitive);
              if (bVar11) goto LAB_001cf21d;
              bVar12 = 0;
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_298);
          }
        }
        QFileInfo::~QFileInfo(&info);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
      pPVar28 = pPVar28 + 1;
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_348);
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_128,"INSTALLS");
  pQVar19 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_128)->
             super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
  iVar20 = QList<ProString>::begin(pQVar19);
  iVar21 = QList<ProString>::end(pQVar19);
  for (; iVar20.i != iVar21.i; iVar20.i = iVar20.i + 1) {
    local_278.size = -0x5555555555555556;
    local_278.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_278.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    local_180.a.a.a.a.a.a.m_data = ".path";
    local_180.a.a.a.a.a.a.m_size = (qsizetype)iVar20.i;
    ProString::ProString<ProString_const&,char_const(&)[6]>
              ((ProString *)&local_a8,
               (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)&local_180);
    QMakeEvaluator::first((ProString *)local_128,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_a8);
    ProString::toQString((QString *)&local_278,(ProString *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    if ((ProString *)local_278.size == (ProString *)0x0) {
      QString::operator=((QString *)&local_278,(QString *)local_248);
    }
    uVar13 = (ushort)*(char16_t *)&((local_278.ptr)->m_string).d.d - 0x25;
    if ((0x37 < uVar13) || ((0x80000000000401U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) {
      local_180.a.a.a.a.a.a.m_size = (qsizetype)local_248;
      local_180.a.a.a.a.a.a.m_data = (char *)CONCAT71(local_180.a.a.a.a.a.a.m_data._1_7_,0x5c);
      local_180.a.a.a.a.a.b = (QString *)&local_278;
      QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>::convertTo<QString>
                ((QString *)&local_a8,
                 (QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&> *)&local_180);
      Option::fixPathToTargetOS((QString *)local_128,(QString *)&local_a8,true,true);
      qVar15 = local_278.size;
      pPVar28 = local_278.ptr;
      pDVar8 = local_278.d;
      local_278.d = (Data *)local_128._0_8_;
      local_278.ptr = (ProString *)local_128._8_8_;
      local_128._0_8_ = pDVar8;
      local_128._8_8_ = pPVar28;
      local_278.size = local_128._16_8_;
      local_128._16_8_ = qVar15;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    }
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    local_a8.a.a.a.a.a.a.a.m_data = ".files";
    local_a8.a.a.a.a.a.a.a.m_size = (qsizetype)iVar20.i;
    ProString::ProString<ProString_const&,char_const(&)[7]>
              ((ProString *)local_128,
               (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_a8);
    pQVar19 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)local_128)->
               super_QList<ProString>;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    this_00 = QList<ProString>::begin(pQVar19);
    iVar22 = QList<ProString>::end(pQVar19);
    while( true ) {
      if (this_00.i == iVar22.i) break;
      local_298._0_8_ = local_278.d;
      local_298._8_8_ = local_278.ptr;
      local_298._16_8_ = local_278.size;
      if ((ProString *)local_278.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_278.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_278.d)->super_QArrayData)->d).d + 1;
        UNLOCK();
      }
      local_2b8.size = -0x5555555555555556;
      local_2b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_2b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)local_128,this_00.i);
      Option::normalizePath((QString *)&local_2b8,(QString *)local_128,true,true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      local_2d8.d = (Data *)0x0;
      local_2d8.ptr = (char16_t *)0x0;
      local_2d8.size = 0;
      _info_1 = 0xaaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo(&info_1,(QString *)&local_2b8);
      _info = (ProString *)0x0;
      cVar10 = QFileInfo::isDir();
      if (cVar10 == '\0') {
        QFileInfo::fileName();
        qVar15 = local_2d8.size;
        pcVar5 = local_2d8.ptr;
        pDVar4 = local_2d8.d;
        local_2d8.d = (Data *)local_128._0_8_;
        local_2d8.ptr = (char16_t *)local_128._8_8_;
        local_128._0_8_ = pDVar4;
        local_128._8_8_ = pcVar5;
        local_2d8.size = local_128._16_8_;
        local_128._16_8_ = qVar15;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
        QFileInfo::absolutePath();
      }
      else {
        pQVar23 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>("*");
        QString::operator=((QString *)&local_2d8,pQVar23);
        QFileInfo::fileName();
        local_128._24_8_ = local_a8.a.a.a.a.a.a.b;
        local_128._16_8_ = local_a8.a.a.a.a.a.a.a.m_data;
        local_128._8_8_ = local_a8.a.a.a.a.a.a.a.m_size;
        local_128._0_8_ = "\\";
        local_a8.a.a.a.a.a.a.a.m_size = 0;
        local_a8.a.a.a.a.a.a.a.m_data = (char *)0x0;
        local_a8.a.a.a.a.a.a.b = (QString *)0x0;
        ::operator+=((QString *)local_298,(QStringBuilder<const_char_(&)[2],_QString> *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_128 + 8));
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
        QFileInfo::absoluteFilePath();
      }
      uVar9 = local_128._16_8_;
      pPVar28 = _info;
      _info = (ProString *)local_128._0_8_;
      local_128._0_8_ = pPVar28;
      local_128._8_8_ = (ProString *)0x0;
      local_128._16_8_ = (ProString *)0x0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      _dirList = 0xaaaaaaaaaaaaaaaa;
      local_a8.a.a.a.a.a.a.a.m_size = (qsizetype)local_2d8.d;
      local_a8.a.a.a.a.a.a.a.m_data = (char *)local_2d8.ptr;
      local_a8.a.a.a.a.a.a.b = (QString *)local_2d8.size;
      if ((ProString *)local_2d8.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_2d8.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_2d8.d)->super_QArrayData)->d).d + 1;
        UNLOCK();
      }
      args._M_len = 1;
      args._M_array = (iterator)&local_a8;
      QList<QString>::QList((QList<QString> *)local_128,args);
      QDirListing::QDirListing
                (&dirList,&info,(QStringBuilder<const_char_(&)[2],_QString> *)local_128,0x438);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      for (DVar24.dirListPtr = (QDirListingPrivate *)QDirListing::begin();
          DVar24.dirListPtr != (QDirListingPrivate *)0x0;
          DVar24.dirListPtr = (QDirListingPrivate *)QDirListing::next(DVar24)) {
        _info2 = (ProString *)0xaaaaaaaaaaaaaaaa;
        QDirListing::DirEntry::absolutePath();
        Option::fixPathToTargetOS((QString *)&info2,(QString *)local_128,true,true);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
        iVar26 = -0x55555556 - (int)uVar9;
        QDirListing::DirEntry::fileName();
        local_348.a.d.size = local_368.size;
        local_348.a.d.ptr = local_368.ptr;
        local_348.a.d.d = local_368.d;
        local_368.d = (Data *)0x0;
        local_368.ptr = (char16_t *)0x0;
        local_368.size = 0;
        local_348.b = (char (*) [2])0x21a2c9;
        QStringBuilder<QString,_const_char_(&)[2]>::QStringBuilder
                  ((QStringBuilder<QString,_const_char_(&)[2]> *)&local_228,&local_348);
        local_228.a.a.b.m_data = (char *)&info2;
        QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&> *)
                   local_1d8,
                   (QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&> *)
                   &local_228);
        local_1d8._40_8_ = "|";
        QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>
                          *)&local_180,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>
                          *)local_1d8);
        local_180.a.a.b.d.d = (Data *)local_298;
        if (iVar26 == 0) {
          qVar15 = QtPrivate::lengthHelperPointer<char>("");
          latin1_00.m_data = "";
          latin1_00.m_size = qVar15;
          QString::QString((QString *)&local_380,latin1_00);
        }
        else {
          QString::right((QString *)&local_380,(QString *)&info2,(long)iVar26);
        }
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)&local_a8,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&local_180,(QString *)&local_380);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)local_128,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)&local_a8);
        local_d8 = "|0;";
        ::operator+=(&(this->vcProject).Configuration.deployment.AdditionalFiles,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                      *)local_128);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                           *)local_128);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                           *)&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_380);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_180);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_348);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_368);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info2);
      }
      QDirListing::~QDirListing(&dirList);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
      QFileInfo::~QFileInfo(&info_1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_298);
      this_00.i = this_00.i + 1;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_260);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_248);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initDeploymentTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    QString targetPath;
    targetPath = project->values("deploy.path").join(' ');
    if (targetPath.isEmpty())
        targetPath = QString("%CSIDL_PROGRAM_FILES%\\") + project->first("TARGET");
    if (targetPath.endsWith("/") || targetPath.endsWith("\\"))
        targetPath.chop(1);
    conf.deployment.RemoteDirectory = targetPath;
    const ProStringList dllPaths = project->values("QMAKE_DLL_PATHS");
    // Only deploy Qt libs for shared build
    if (!dllPaths.isEmpty()) {
        // FIXME: This code should actually resolve the libraries from all Qt modules.
        ProStringList arg = project->values("LIBS") + project->values("LIBS_PRIVATE")
                + project->values("QMAKE_LIBS") + project->values("QMAKE_LIBS_PRIVATE");
        bool qpaPluginDeployed = false;
        for (ProStringList::ConstIterator it = arg.constBegin(); it != arg.constEnd(); ++it) {
            QString dllName = (*it).toQString();
            dllName.replace(QLatin1Char('\\'), QLatin1Char('/'));
            // LIBPATH isn't relevant for deployment
            if (dllName.startsWith(QLatin1String("/LIBPATH:")))
                continue;
            // We want to deploy .dlls not .libs
            if (dllName.endsWith(QLatin1String(".lib")))
                dllName.replace(dllName.size() - 3, 3, QLatin1String("dll"));
            // Use only the file name and check in Qt's install path and LIBPATHs to check for existence
            dllName.remove(0, dllName.lastIndexOf(QLatin1Char('/')) + 1);
            QFileInfo info;
            for (const ProString &dllPath : dllPaths) {
                QString absoluteDllFilePath = dllPath.toQString();
                if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                    absoluteDllFilePath += QLatin1Char('/');
                absoluteDllFilePath += dllName;
                info = QFileInfo(absoluteDllFilePath);
                if (info.exists())
                    break;
            }

            if (!info.exists())
                continue;

            conf.deployment.AdditionalFiles += info.fileName()
                    + "|" + QDir::toNativeSeparators(info.absolutePath())
                    + "|" + targetPath
                    + "|0;";
            if (!qpaPluginDeployed) {
                QString debugInfix;
                bool foundGuid = dllName.contains(QLatin1String("Guid"));
                if (foundGuid)
                    debugInfix = QLatin1Char('d');

                if (foundGuid || dllName.contains(QLatin1String("Gui"))) {
                    QFileInfo info2;
                    for (const ProString &dllPath : dllPaths) {
                        QString absoluteDllFilePath = dllPath.toQString();
                        if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                            absoluteDllFilePath += QLatin1Char('/');
                        absoluteDllFilePath += QLatin1String("../plugins/platforms/qwindows")
                                + debugInfix + QLatin1String(".dll");
                        info2 = QFileInfo(absoluteDllFilePath);
                        if (info2.exists())
                            break;
                    }
                    if (info2.exists()) {
                        conf.deployment.AdditionalFiles += QLatin1String("qwindows") + debugInfix + QLatin1String(".dll")
                                                    + QLatin1Char('|') + QDir::toNativeSeparators(info2.absolutePath())
                                                    + QLatin1Char('|') + targetPath + QLatin1String("\\platforms")
                                                    + QLatin1String("|0;");
                        qpaPluginDeployed = true;
                    }
                }
            }
        }
    }

    for (const ProString &item : project->values("INSTALLS")) {
        // get item.path
        QString devicePath = project->first(ProKey(item + ".path")).toQString();
        if (devicePath.isEmpty())
            devicePath = targetPath;
        // check if item.path is relative (! either /,\ or %)
        if (!(devicePath.at(0) == QLatin1Char('/')
            || devicePath.at(0) == QLatin1Char('\\')
            || devicePath.at(0) == QLatin1Char('%'))) {
            // create output path
            devicePath = Option::fixPathToTargetOS(targetPath + QLatin1Char('\\') + devicePath);
        }
        // foreach d in item.files
        for (const ProString &src : project->values(ProKey(item + ".files"))) {
            QString itemDevicePath = devicePath;
            QString source = Option::normalizePath(src.toQString());
            QString nameFilter;
            QFileInfo info(source);
            QString searchPath;
            if (info.isDir()) {
                nameFilter = QLatin1String("*");
                itemDevicePath += "\\" + info.fileName();
                searchPath = info.absoluteFilePath();
            } else {
                nameFilter = info.fileName();
                searchPath = info.absolutePath();
            }

            int pathSize = searchPath.size();
            using F = QDirListing::IteratorFlag;
            QDirListing dirList(searchPath, QStringList{nameFilter}, F::FilesOnly | F::ResolveSymlinks | F::Recursive);
            // foreach dirIterator-entry in d
            for (const auto &dirEntry : dirList) {
                const QString absoluteItemPath = Option::fixPathToTargetOS(dirEntry.absolutePath());
                // Identify if it is just another subdir
                int diffSize = absoluteItemPath.size() - pathSize;
                // write out rules
                conf.deployment.AdditionalFiles += dirEntry.fileName()
                        + "|" + absoluteItemPath
                        + "|" + itemDevicePath + (diffSize ? (absoluteItemPath.right(diffSize)) : QLatin1String(""))
                        + "|0;";
            }
        }
    }
}